

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.cpp
# Opt level: O3

size_t duckdb_zstd::FSE_normalizeCount
                 (short *normalizedCounter,uint tableLog,uint *count,size_t total,
                 uint maxSymbolValue,uint useLowProbCount)

{
  undefined1 auVar1 [16];
  char cVar2;
  byte bVar3;
  short sVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  short *psVar11;
  uint uVar12;
  ulong uVar13;
  ushort uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  
  uVar13 = 0xb;
  if (tableLog != 0) {
    uVar13 = (ulong)tableLog;
  }
  uVar20 = (uint)uVar13;
  sVar7 = 0xffffffffffffffff;
  if ((4 < uVar20) && (sVar7 = 0xffffffffffffffd4, uVar20 < 0xd)) {
    uVar10 = 0x1f;
    if ((uint)total != 0) {
      for (; (uint)total >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    uVar5 = (uVar10 ^ 0xffffffe0) + 0x21;
    uVar10 = 0x1f;
    if (maxSymbolValue != 0) {
      for (; maxSymbolValue >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    uVar10 = (uVar10 ^ 0xffffffe0) + 0x22;
    if (uVar5 < uVar10) {
      uVar10 = uVar5;
    }
    sVar7 = 0xffffffffffffffff;
    if (uVar10 <= uVar20) {
      uVar14 = -(ushort)(useLowProbCount != 0) | 1;
      bVar3 = (byte)uVar13;
      cVar2 = -bVar3;
      bVar8 = cVar2 + 0x3e;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = total & 0xffffffff;
      uVar5 = 1 << (bVar3 & 0x1f);
      uVar6 = 0;
      uVar10 = 0;
      uVar12 = 0;
      uVar20 = uVar5;
      do {
        uVar18 = (ulong)count[uVar12];
        if (uVar18 == total) {
          return 0;
        }
        uVar19 = (uint)(total >> (bVar3 & 0x3f));
        if (uVar18 == 0) {
          normalizedCounter[uVar12] = 0;
        }
        else if (uVar19 < count[uVar12]) {
          uVar18 = uVar18 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
          uVar16 = uVar18 >> (bVar8 & 0x3f);
          if ((uVar16 & 0xfff8) == 0) {
            uVar16 = (ulong)((int)uVar16 +
                            (uint)((ulong)FSE_normalizeCount::rtbTable[uVar16 & 0xffff] <<
                                   (cVar2 + 0x2aU & 0x3f) <
                                  uVar18 - ((uVar16 & 0xffff) << (bVar8 & 0x3f))));
          }
          uVar9 = (ushort)uVar16;
          if ((ushort)uVar6 < uVar9) {
            uVar10 = uVar12;
          }
          if ((ushort)uVar6 < uVar9) {
            uVar6 = uVar16 & 0xffff;
          }
          normalizedCounter[uVar12] = uVar9;
          uVar20 = uVar20 - (int)(uVar16 & 0xffff);
        }
        else {
          normalizedCounter[uVar12] = uVar14;
          uVar20 = uVar20 - 1;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 <= maxSymbolValue);
      sVar4 = normalizedCounter[uVar10];
      iVar15 = (int)sVar4 >> 1;
      if (iVar15 == -uVar20 || SBORROW4(iVar15,-uVar20) != (int)(iVar15 + uVar20) < 0) {
        uVar16 = total * 3 >> (bVar3 + 1 & 0x3f);
        uVar18 = (ulong)(maxSymbolValue + 1);
        uVar6 = 0;
        uVar10 = 0;
        do {
          uVar20 = count[uVar6];
          if ((ulong)uVar20 == 0) {
            normalizedCounter[uVar6] = 0;
          }
          else {
            if (uVar19 < uVar20) {
              if ((uint)uVar16 < uVar20) {
                normalizedCounter[uVar6] = -2;
                goto LAB_0127d1cd;
              }
              normalizedCounter[uVar6] = 1;
            }
            else {
              normalizedCounter[uVar6] = uVar14;
            }
            uVar10 = uVar10 + 1;
            total = total - uVar20;
          }
LAB_0127d1cd:
          uVar6 = uVar6 + 1;
        } while (uVar18 != uVar6);
        uVar20 = uVar5 - uVar10;
        if (uVar20 == 0) {
          return uVar13;
        }
        if ((uVar16 & 0xffffffff) < total / uVar20) {
          uVar6 = total * 3;
          uVar16 = 0;
          do {
            if ((normalizedCounter[uVar16] == -2) &&
               (uVar12 = count[uVar16], uVar12 <= (uint)(uVar6 / (uVar20 * 2)))) {
              normalizedCounter[uVar16] = 1;
              uVar10 = uVar10 + 1;
              total = total - uVar12;
            }
            uVar16 = uVar16 + 1;
          } while (uVar18 != uVar16);
          uVar20 = uVar5 - uVar10;
        }
        if (uVar10 != maxSymbolValue + 1) {
          if (total == 0) {
            if (uVar20 == 0) {
              return uVar13;
            }
            uVar6 = 0;
            do {
              if (0 < normalizedCounter[uVar6]) {
                uVar20 = uVar20 - 1;
                normalizedCounter[uVar6] = normalizedCounter[uVar6] + 1;
              }
              uVar10 = (uint)uVar6;
              uVar6 = (ulong)(uVar10 + 1);
              if (uVar10 == maxSymbolValue) {
                uVar6 = 0;
              }
            } while (uVar20 != 0);
            return uVar13;
          }
          uVar18 = ~(-1L << (cVar2 + 0x3dU & 0x3f));
          uVar10 = 0;
          uVar6 = uVar18;
          do {
            uVar16 = uVar6;
            if (normalizedCounter[uVar10] == -2) {
              uVar16 = (ulong)count[uVar10] *
                       ((((ulong)uVar20 << (bVar8 & 0x3f)) + uVar18) / (total & 0xffffffff)) + uVar6
              ;
              uVar6 = uVar6 >> (bVar8 & 0x3f);
              uVar17 = uVar16 >> (bVar8 & 0x3f);
              if (uVar17 == uVar6) {
                return 0xffffffffffffffff;
              }
              normalizedCounter[uVar10] = (short)uVar17 - (short)uVar6;
            }
            uVar10 = uVar10 + 1;
            uVar6 = uVar16;
          } while (uVar10 <= maxSymbolValue);
          return uVar13;
        }
        uVar16 = 0;
        uVar10 = 0;
        uVar6 = 0;
        do {
          if (uVar10 < count[uVar16]) {
            uVar6 = uVar16 & 0xffffffff;
            uVar10 = count[uVar16];
          }
          uVar16 = uVar16 + 1;
        } while (uVar18 != uVar16);
        psVar11 = normalizedCounter + uVar6;
        sVar4 = *psVar11;
      }
      else {
        psVar11 = normalizedCounter + uVar10;
      }
      *psVar11 = sVar4 + (short)uVar20;
      sVar7 = uVar13;
    }
  }
  return sVar7;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue, unsigned useLowProbCount)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        short const lowProbCount = useLowProbCount ? -1 : 1;
        U64 const scale = 62 - tableLog;
        U64 const step = ZSTD_div64((U64)1<<62, (U32)total);   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = lowProbCount;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue, lowProbCount);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}